

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

voffset_t __thiscall flatbuffers::Table::GetOptionalFieldOffset(Table *this,voffset_t field)

{
  unsigned_short uVar1;
  uint8_t *p;
  unsigned_short vtsize;
  uint8_t *vtable;
  voffset_t field_local;
  Table *this_local;
  
  p = GetVTable(this);
  uVar1 = ReadScalar<unsigned_short>(p);
  if (field < uVar1) {
    uVar1 = ReadScalar<unsigned_short>(p + (int)(uint)field);
  }
  else {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

voffset_t GetOptionalFieldOffset(voffset_t field) const {
    // The vtable offset is always at the start.
    auto vtable = GetVTable();
    // The first element is the size of the vtable (fields + type id + itself).
    auto vtsize = ReadScalar<voffset_t>(vtable);
    // If the field we're accessing is outside the vtable, we're reading older
    // data, so it's the same as if the offset was 0 (not present).
    return field < vtsize ? ReadScalar<voffset_t>(vtable + field) : 0;
  }